

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O3

ENetListIterator enet_list_insert(ENetListIterator position,void *data)

{
  _ENetListNode *p_Var1;
  ENetListIterator result;
  
  p_Var1 = position->previous;
  *(_ENetListNode **)((long)data + 8) = p_Var1;
  *(ENetListIterator *)data = position;
  p_Var1->next = (_ENetListNode *)data;
  position->previous = (_ENetListNode *)data;
  return (ENetListIterator)data;
}

Assistant:

ENetListIterator
enet_list_insert (ENetListIterator position, void * data)
{
   ENetListIterator result = (ENetListIterator) data;

   result -> previous = position -> previous;
   result -> next = position;

   result -> previous -> next = result;
   position -> previous = result;

   return result;
}